

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

bool __thiscall
caffe::ParamSpec::MergePartialFromCodedStream(ParamSpec *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  UnknownFieldSet *pUVar5;
  string *psVar6;
  float *value_00;
  char cVar7;
  uint tag;
  ulong uVar8;
  int value;
  float *local_38;
  
  local_38 = &this->decay_mult_;
LAB_0048e9ea:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0048ea0e;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0048ea0e:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar8 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar4 | uVar8;
    }
    tag = (uint)uVar8;
    if ((uVar8 & 0x100000000) == 0) goto switchD_0048ea7d_default;
    cVar7 = (char)uVar8;
    switch((uint)(uVar8 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar7 == '\n') {
        psVar6 = mutable_name_abi_cxx11_(this);
        bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
        if (!bVar3) {
          return false;
        }
        psVar6 = (this->name_).ptr_;
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  ((psVar6->_M_dataplus)._M_p,(int)psVar6->_M_string_length,PARSE,
                   "caffe.ParamSpec.name");
        goto LAB_0048e9ea;
      }
      break;
    case 2:
      if (cVar7 == '\x10') {
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,&value);
        if (!bVar3) {
          return false;
        }
        if ((uint)value < 2) {
          set_share_mode(this,value);
        }
        else {
          pUVar5 = mutable_unknown_fields(this);
          google::protobuf::UnknownFieldSet::AddVarint(pUVar5,2,(long)value);
        }
        goto LAB_0048e9ea;
      }
      break;
    case 3:
      if (cVar7 != '\x1d') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      value_00 = &this->lr_mult_;
LAB_0048eaeb:
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (input,value_00);
      goto LAB_0048ea60;
    case 4:
      if (cVar7 == '%') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        value_00 = local_38;
        goto LAB_0048eaeb;
      }
    }
switchD_0048ea7d_default:
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    pUVar5 = mutable_unknown_fields(this);
    bVar3 = google::protobuf::internal::WireFormat::SkipField(input,tag,pUVar5);
LAB_0048ea60:
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool ParamSpec::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.ParamSpec)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.ParamSpec.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ParamSpec.DimCheckMode share_mode = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::ParamSpec_DimCheckMode_IsValid(value)) {
            set_share_mode(static_cast< ::caffe::ParamSpec_DimCheckMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(2, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float lr_mult = 3 [default = 1];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {
          set_has_lr_mult();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &lr_mult_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float decay_mult = 4 [default = 1];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(37u)) {
          set_has_decay_mult();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &decay_mult_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.ParamSpec)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.ParamSpec)
  return false;
#undef DO_
}